

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::x86::X86RAPass::_rewrite(X86RAPass *this,BaseNode *first,BaseNode *stop)

{
  BaseNode BVar1;
  BaseNode BVar2;
  uint uVar3;
  long *plVar4;
  BaseBuilder *pBVar5;
  long lVar6;
  byte *pbVar7;
  undefined8 uVar8;
  byte bVar9;
  Error EVar10;
  int iVar11;
  undefined4 uVar12;
  BaseNode *pBVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  byte bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  Error local_58;
  undefined4 local_40;
  undefined4 local_3c;
  undefined8 local_38;
  
  uVar3 = *(uint *)&(this->super_BaseRAPass).super_FuncPass.super_Pass._cb[1].super_BaseEmitter.
                    _logger;
  do {
    if (first == stop) {
      return 0;
    }
    pBVar13 = *(BaseNode **)(first + 8);
    bVar19 = 0;
    if (((byte)first[0x11] & 0x20) != 0) {
      plVar4 = *(long **)(first + 0x20);
      BVar1 = first[0x12];
      if (plVar4 == (long *)0x0) {
LAB_0014bc75:
        bVar9 = 0;
        if (BVar1 != (BaseNode)0x0) {
          pBVar5 = (this->super_BaseRAPass).super_FuncPass.super_Pass._cb;
          lVar17 = 0;
          do {
            bVar20 = true;
            if ((*(uint *)(first + lVar17 + 0x40) & 0x2007) == 0x2002) {
              uVar16 = *(int *)(first + lVar17 + 0x44) - 0x100;
              bVar20 = uVar16 < uVar3;
              if (bVar20) {
                if (uVar16 < *(uint *)&pBVar5[1].super_BaseEmitter._logger) {
                  lVar6 = *(long *)((long)(&(pBVar5[1].super_BaseEmitter._code)->_environment)
                                          [uVar16] + 0x28);
                  if (lVar6 != 0) {
                    uVar16 = (this->super_BaseRAPass)._sp.super_Operand.super_Operand_._signature.
                             _bits;
                    pbVar7 = *(byte **)(lVar6 + 0x18);
                    iVar11 = *(int *)(pbVar7 + 0x10);
                    *(uint *)(first + lVar17 + 0x44) = (uint)*pbVar7;
                    *(uint *)(first + lVar17 + 0x40) =
                         *(uint *)(first + lVar17 + 0x40) & 0xffffdf02 | uVar16 & 0xf8;
                    *(int *)(first + lVar17 + 0x4c) = *(int *)(first + lVar17 + 0x4c) + iVar11;
                    goto LAB_0014bd18;
                  }
                }
                else {
                  _rewrite();
                }
                _rewrite();
                goto LAB_0014be44;
              }
              local_58 = 0x1e;
            }
LAB_0014bd18:
            if (!bVar20) {
              bVar9 = 1;
              break;
            }
            lVar17 = lVar17 + 0x10;
          } while ((ulong)(byte)BVar1 * 0x10 != lVar17);
        }
      }
      else {
        *(undefined8 *)(first + 0x20) = 0;
        uVar16 = *(uint *)(plVar4 + 2);
        bVar19 = false;
        if ((ulong)uVar16 != 0) {
          uVar14 = 0;
          do {
            lVar17 = uVar14 * 0x20;
            uVar18 = *(uint *)((long)plVar4 + lVar17 + 100);
            if (uVar18 != 0) {
              bVar9 = *(byte *)((long)plVar4 + lVar17 + 0x5a);
              do {
                uVar15 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                  }
                }
                if (0x19 < uVar15) {
                  _rewrite();
                  goto LAB_0014be1c;
                }
                if (bVar19 <= bVar9) {
                  bVar19 = bVar9;
                }
                *(uint *)(first + (ulong)uVar15 * 4 + 0x3c) = (uint)bVar9;
                uVar18 = uVar18 - 1 & uVar18;
              } while (uVar18 != 0);
            }
            uVar18 = *(uint *)(plVar4 + uVar14 * 4 + 0xd);
            if (uVar18 != 0) {
              bVar9 = *(byte *)((long)plVar4 + lVar17 + 0x5b);
              do {
                uVar15 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                  }
                }
                if (0x19 < uVar15) {
LAB_0014be1c:
                  _rewrite();
                  return 0;
                }
                if (bVar19 <= bVar9) {
                  bVar19 = bVar9;
                }
                *(uint *)(first + (ulong)uVar15 * 4 + 0x3c) = (uint)bVar9;
                uVar18 = uVar18 - 1 & uVar18;
              } while (uVar18 != 0);
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar16);
          bVar19 = 0xf < bVar19;
        }
        uVar16 = *(uint *)((long)plVar4 + 0xc);
        if ((uVar16 >> 0x1e & 1) != 0) {
          iVar11 = *(int *)(first + 0x30);
          if (iVar11 < 0x1d3) {
            if (iVar11 < 0x167) {
              if (iVar11 == 0x165) {
                if (((*(uint *)(first + 0x40) & 0xf07) == 1) &&
                   (uVar18 = *(uint *)(first + 0x50), (uVar18 & 7) == 2)) {
                  uVar12 = 0x1de;
                  uVar15 = 0x1000000;
LAB_0014bbac:
                  *(uint *)(first + 0x50) = uVar18 & 0xfffffa | uVar15;
                  *(undefined4 *)(first + 0x30) = uVar12;
                }
              }
              else if (iVar11 == 0x166) {
LAB_0014ba57:
                if (((*(uint *)(first + 0x40) & 0xf07) == 1) &&
                   (uVar18 = *(uint *)(first + 0x50), (uVar18 & 7) == 2)) {
                  uVar12 = 0x1b7;
                  uVar15 = 0x4000000;
                  goto LAB_0014bbac;
                }
              }
            }
            else {
              if (iVar11 == 0x167) goto LAB_0014bb04;
              if (iVar11 == 0x1bc) goto LAB_0014ba57;
            }
          }
          else if (iVar11 < 0x4c0) {
            if (iVar11 == 0x1d3) {
LAB_0014bb04:
              if (((*(uint *)(first + 0x40) & 0xf07) == 1) &&
                 (uVar18 = *(uint *)(first + 0x50), (uVar18 & 7) == 2)) {
                uVar12 = 0x1b7;
                uVar15 = 0x8000000;
                goto LAB_0014bbac;
              }
            }
            else if (iVar11 == 0x4aa) goto LAB_0014ba57;
          }
          else {
            if (iVar11 == 0x4c0) goto LAB_0014bb04;
            if (((iVar11 == 0x4c8) && ((*(uint *)(first + 0x40) & 0xf07) == 1)) &&
               (uVar18 = *(uint *)(first + 0x50), (uVar18 & 7) == 2)) {
              uVar12 = 0x1de;
              uVar15 = 0x2000000;
              goto LAB_0014bbac;
            }
          }
        }
        if (((int)uVar16 < 0 & bVar19) == 1) {
          iVar11 = *(int *)(first + 0x30);
          if (iVar11 < 0x4f0) {
            if (iVar11 < 0x485) {
              if (iVar11 < 0x3d7) {
                uVar12 = 0x360;
                if (iVar11 != 0x35e) {
                  if (iVar11 != 0x364) {
LAB_0014be5c:
                    DebugUtils::assertionFailed
                              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/x86/x86rapass.cpp"
                               ,0x4fc,"false");
                  }
                  uVar12 = 0x366;
                }
              }
              else if (iVar11 == 0x3d7) {
                uVar12 = 0x3d8;
              }
              else {
                if (iVar11 != 0x3dc) goto LAB_0014be5c;
                uVar12 = 0x3dd;
              }
            }
            else if (iVar11 < 0x4ac) {
              if (iVar11 == 0x485) {
                uVar12 = 0x486;
              }
              else {
                if (iVar11 != 0x48a) goto LAB_0014be5c;
                uVar12 = 0x48b;
              }
            }
            else if (iVar11 == 0x4ac) {
              uVar12 = 0x4ad;
            }
            else {
              if (iVar11 != 0x4af) goto LAB_0014be5c;
              uVar12 = 0x4b1;
            }
          }
          else if (iVar11 < 0x62f) {
            if (iVar11 == 0x4f0) {
              uVar12 = 0x4f1;
            }
            else if (iVar11 == 0x4f2) {
              uVar12 = 0x4f3;
            }
            else {
              if (iVar11 != 0x5cf) goto LAB_0014be5c;
              uVar12 = 0x5d0;
            }
          }
          else {
            switch(iVar11) {
            case 0x64e:
              uVar12 = 0x648;
              break;
            case 0x64f:
              uVar12 = 0x64a;
              break;
            case 0x650:
              uVar12 = 0x64b;
              break;
            case 0x651:
              uVar12 = 0x64d;
              break;
            default:
              if (iVar11 != 0x62f) goto LAB_0014be5c;
              uVar12 = 0x630;
            }
          }
          *(undefined4 *)(first + 0x30) = uVar12;
        }
        if ((((*(byte *)(plVar4 + 1) & 1) == 0) || (*(int *)(first + 0x38) != 0)) ||
           (first[0x12] != (BaseNode)0x2)) {
LAB_0014bc5d:
          if (first[0x10] == (BaseNode)0x11) {
            lVar17 = *plVar4;
            bVar20 = BaseRAPass::isNextTo
                               (&this->super_BaseRAPass,first,
                                (BaseNode *)((this->super_BaseRAPass)._func)->_exitNode);
            if (bVar20) {
LAB_0014bdeb:
              uVar8 = *(undefined8 *)first;
              BaseBuilder::removeNode((this->super_BaseRAPass).super_FuncPass.super_Pass._cb,first);
              *(undefined8 *)(lVar17 + 0x18) = uVar8;
              bVar20 = true;
            }
            else {
              ((this->super_BaseRAPass).super_FuncPass.super_Pass._cb)->_cursor =
                   *(BaseNode **)first;
              local_3c = *(undefined4 *)(((this->super_BaseRAPass)._func)->_exitNode + 0x30);
              local_40 = 5;
              local_38 = 0;
              EVar10 = (*(this->super_BaseRAPass).super_FuncPass.super_Pass._vptr_Pass[0xd])
                                 (this,&local_40);
              if (EVar10 == 0) goto LAB_0014bdeb;
              bVar20 = false;
              local_58 = EVar10;
            }
            bVar9 = bVar20 ^ 1;
          }
          else {
            bVar9 = 0;
            bVar20 = true;
          }
        }
        else {
          BVar2 = first[0x13];
          if ((BVar2 == (BaseNode)0x0) || ((byte)BVar2 == 1)) {
LAB_0014be44:
            DebugUtils::assertionFailed
                      ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/x86/../x86/../core/../core/builder.h"
                       ,0x369,"index < opCapacity()");
          }
          auVar21._0_4_ = -(uint)(*(int *)(first + 0x50) == *(int *)(first + 0x40));
          auVar21._4_4_ = -(uint)(*(int *)(first + 0x54) == *(int *)(first + 0x44));
          auVar21._8_4_ = -(uint)(*(int *)(first + 0x58) == *(int *)(first + 0x48));
          auVar21._12_4_ = -(uint)(*(int *)(first + 0x5c) == *(int *)(first + 0x4c));
          iVar11 = movmskps((uint)(byte)BVar2,auVar21);
          if (iVar11 != 0xf) goto LAB_0014bc5d;
          BaseBuilder::removeNode((this->super_BaseRAPass).super_FuncPass.super_Pass._cb,first);
          bVar9 = 0xc;
          bVar20 = false;
        }
        if (bVar20) goto LAB_0014bc75;
      }
      bVar19 = 0;
      if ((bVar9 != 0xc) && (bVar9 != 0)) {
        pBVar13 = first;
        bVar19 = bVar9;
      }
    }
    first = pBVar13;
    if (bVar19 != 0) {
      return local_58;
    }
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SPEED Error X86RAPass::_rewrite(BaseNode* first, BaseNode* stop) noexcept {
  uint32_t virtCount = cc()->_vRegArray.size();

  BaseNode* node = first;
  while (node != stop) {
    BaseNode* next = node->next();
    if (node->isInst()) {
      InstNode* inst = node->as<InstNode>();
      RAInst* raInst = node->passData<RAInst>();

      Operand* operands = inst->operands();
      uint32_t opCount = inst->opCount();
      uint32_t maxRegId = 0;

      uint32_t i;

      // Rewrite virtual registers into physical registers.
      if (raInst) {
        // This data is allocated by Zone passed to `runOnFunction()`, which will be reset after the RA pass finishes.
        // So reset this data to prevent having a dead pointer after the RA pass is complete.
        node->resetPassData();

        // If the instruction contains pass data (raInst) then it was a subject for register allocation and must be
        // rewritten to use physical regs.
        RATiedReg* tiedRegs = raInst->tiedRegs();
        uint32_t tiedCount = raInst->tiedCount();

        for (i = 0; i < tiedCount; i++) {
          RATiedReg* tiedReg = &tiedRegs[i];

          Support::BitWordIterator<uint32_t> useIt(tiedReg->useRewriteMask());
          uint32_t useId = tiedReg->useId();
          while (useIt.hasNext()) {
            maxRegId = Support::max(maxRegId, useId);
            inst->rewriteIdAtIndex(useIt.next(), useId);
          }

          Support::BitWordIterator<uint32_t> outIt(tiedReg->outRewriteMask());
          uint32_t outId = tiedReg->outId();
          while (outIt.hasNext()) {
            maxRegId = Support::max(maxRegId, outId);
            inst->rewriteIdAtIndex(outIt.next(), outId);
          }
        }

        // If one operand was rewritten from Reg to Mem, we have to ensure that we are using the correct instruction.
        if (raInst->isRegToMemPatched()) {
          switch (inst->id()) {
            case Inst::kIdKmovb: {
              if (operands[0].isGp() && operands[1].isMem()) {
                // Transform from [V]MOVD to MOV.
                operands[1].as<Mem>().setSize(1);
                inst->setId(Inst::kIdMovzx);
              }
              break;
            }

            case Inst::kIdVmovw: {
              if (operands[0].isGp() && operands[1].isMem()) {
                // Transform from [V]MOVD to MOV.
                operands[1].as<Mem>().setSize(2);
                inst->setId(Inst::kIdMovzx);
              }
              break;
            }

            case Inst::kIdMovd:
            case Inst::kIdVmovd:
            case Inst::kIdKmovd: {
              if (operands[0].isGp() && operands[1].isMem()) {
                // Transform from [V]MOVD to MOV.
                operands[1].as<Mem>().setSize(4);
                inst->setId(Inst::kIdMov);
              }
              break;
            }

            case Inst::kIdMovq:
            case Inst::kIdVmovq:
            case Inst::kIdKmovq: {
              if (operands[0].isGp() && operands[1].isMem()) {
                // Transform from [V]MOVQ to MOV.
                operands[1].as<Mem>().setSize(8);
                inst->setId(Inst::kIdMov);
              }
              break;
            }

            default:
              break;
          }
        }

        // Transform VEX instruction to EVEX when necessary.
        if (raInst->isTransformable()) {
          if (maxRegId > 15) {
            inst->setId(transformVexToEvex(inst->id()));
          }
        }

        // Remove moves that do not do anything.
        //
        // Usually these moves are inserted during code generation and originally they used different registers. If RA
        // allocated these into the same register such redundant mov would appear.
        if (raInst->hasInstRWFlag(InstRWFlags::kMovOp) && !inst->hasExtraReg()) {
          if (inst->opCount() == 2) {
            if (inst->op(0) == inst->op(1)) {
              cc()->removeNode(node);
              goto Next;
            }
          }
        }

        if (ASMJIT_UNLIKELY(node->type() != NodeType::kInst)) {
          // FuncRet terminates the flow, it must either be removed if the exit label is next to it (optimization) or
          // patched to an architecture dependent jump instruction that jumps to the function's exit before the epilog.
          if (node->type() == NodeType::kFuncRet) {
            RABlock* block = raInst->block();
            if (!isNextTo(node, _func->exitNode())) {
              cc()->_setCursor(node->prev());
              ASMJIT_PROPAGATE(emitJump(_func->exitNode()->label()));
            }

            BaseNode* prev = node->prev();
            cc()->removeNode(node);
            block->setLast(prev);
          }
        }
      }

      // Rewrite stack slot addresses.
      for (i = 0; i < opCount; i++) {
        Operand& op = operands[i];
        if (op.isMem()) {
          BaseMem& mem = op.as<BaseMem>();
          if (mem.isRegHome()) {
            uint32_t virtIndex = Operand::virtIdToIndex(mem.baseId());
            if (ASMJIT_UNLIKELY(virtIndex >= virtCount))
              return DebugUtils::errored(kErrorInvalidVirtId);

            VirtReg* virtReg = cc()->virtRegByIndex(virtIndex);
            RAWorkReg* workReg = virtReg->workReg();
            ASMJIT_ASSERT(workReg != nullptr);

            RAStackSlot* slot = workReg->stackSlot();
            int32_t offset = slot->offset();

            mem._setBase(_sp.type(), slot->baseRegId());
            mem.clearRegHome();
            mem.addOffsetLo32(offset);
          }
        }
      }
    }

Next:
    node = next;
  }

  return kErrorOk;
}